

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

QArrayDataPointer<bool> *
QArrayDataPointer<bool>::allocateGrow
          (QArrayDataPointer<bool> *__return_storage_ptr__,QArrayDataPointer<bool> *from,qsizetype n
          ,GrowthPosition position)

{
  bool *pbVar1;
  long lVar2;
  Int IVar3;
  bool *pbVar4;
  long lVar5;
  Data *pDVar6;
  ulong uVar7;
  bool *pbVar8;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = from->d;
  if (pDVar6 == (Data *)0x0) {
    pbVar1 = (bool *)0x0;
    pbVar4 = (bool *)from->size;
    if ((long)from->size < 1) {
      pbVar4 = pbVar1;
    }
    pbVar4 = pbVar4 + n;
  }
  else {
    pbVar1 = (bool *)(pDVar6->super_QArrayData).alloc;
    pbVar4 = (bool *)from->size;
    pbVar8 = pbVar1;
    if ((long)pbVar1 < (long)pbVar4) {
      pbVar8 = pbVar4;
    }
    uVar7 = (ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0;
    if (position == GrowsAtEnd) {
      pbVar8 = from->ptr + ((long)(pbVar4 + (long)(pbVar8 + n)) - (long)(pbVar1 + uVar7));
    }
    else {
      pbVar8 = pbVar8 + n + (uVar7 - (long)from->ptr);
      pbVar1 = (bool *)(pDVar6->super_QArrayData).alloc;
    }
    pbVar4 = pbVar8;
    if ((long)pbVar8 < (long)pbVar1) {
      pbVar4 = pbVar1;
    }
    if (((pDVar6->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      pbVar4 = pbVar8;
    }
  }
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pbVar1 = (bool *)QArrayData::allocate1
                             (&local_38,(longlong)pbVar4,(uint)((long)pbVar4 <= (long)pbVar1));
  if (pbVar1 != (bool *)0x0 && local_38 != (QArrayData *)0x0) {
    if (position == GrowsAtBeginning) {
      lVar5 = (local_38->alloc - (from->size + n)) / 2;
      lVar2 = 0;
      if (0 < lVar5) {
        lVar2 = lVar5;
      }
      lVar2 = lVar2 + n;
      pDVar6 = from->d;
    }
    else {
      pDVar6 = from->d;
      lVar2 = (long)from->ptr -
              ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
      if (pDVar6 == (Data *)0x0) {
        lVar2 = 0;
      }
    }
    if (pDVar6 == (Data *)0x0) {
      IVar3 = 0;
    }
    else {
      IVar3 = (pDVar6->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>
              .super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    pbVar1 = pbVar1 + lVar2;
    (local_38->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar3;
  }
  __return_storage_ptr__->d = (Data *)local_38;
  __return_storage_ptr__->ptr = pbVar1;
  __return_storage_ptr__->size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QArrayDataPointer allocateGrow(const QArrayDataPointer &from, qsizetype n, QArrayData::GrowthPosition position)
    {
        // calculate new capacity. We keep the free capacity at the side that does not have to grow
        // to avoid quadratic behavior with mixed append/prepend cases

        // use qMax below, because constAllocatedCapacity() can be 0 when using fromRawData()
        qsizetype minimalCapacity = qMax(from.size, from.constAllocatedCapacity()) + n;
        // subtract the free space at the side we want to allocate. This ensures that the total size requested is
        // the existing allocation at the other side + size + n.
        minimalCapacity -= (position == QArrayData::GrowsAtEnd) ? from.freeSpaceAtEnd() : from.freeSpaceAtBegin();
        qsizetype capacity = from.detachCapacity(minimalCapacity);
        const bool grows = capacity > from.constAllocatedCapacity();
        auto [header, dataPtr] = Data::allocate(capacity, grows ? QArrayData::Grow : QArrayData::KeepSize);
        const bool valid = header != nullptr && dataPtr != nullptr;
        if (!valid)
            return QArrayDataPointer(header, dataPtr);

        // Idea: * when growing backwards, adjust pointer to prepare free space at the beginning
        //       * when growing forward, adjust by the previous data pointer offset
        dataPtr += (position == QArrayData::GrowsAtBeginning)
                ? n + qMax(0, (header->alloc - from.size - n) / 2)
                : from.freeSpaceAtBegin();
        header->flags = from.flags();
        return QArrayDataPointer(header, dataPtr);
    }